

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O2

void __thiscall
slang::ast::FirstMatchAssertionExpr::visitExprs<slang::ast::DriverVisitor&>
          (FirstMatchAssertionExpr *this,DriverVisitor *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  
  AssertionExpr::visit<slang::ast::DriverVisitor>(this->seq,visitor);
  ppEVar1 = (this->matchItems)._M_ptr;
  sVar2 = (this->matchItems)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::DriverVisitor&>(*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        seq.visit(visitor);
        for (auto item : matchItems)
            item->visit(visitor);
    }